

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  Table *pTVar1;
  int iVar2;
  char *pcVar3;
  Expr *pEVar4;
  Expr *pCExpr_1;
  char *zCName;
  Expr *pCExpr;
  int local_40;
  int nTerm;
  int i;
  int iCol;
  Column *pCol;
  Table *pTab;
  int sortOrder_local;
  int autoInc_local;
  int onError_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  pTVar1 = pParse->pNewTable;
  _i = (Column *)0x0;
  nTerm = -1;
  _autoInc_local = pList;
  if (pTVar1 != (Table *)0x0) {
    if ((pTVar1->tabFlags & 4) == 0) {
      pTVar1->tabFlags = pTVar1->tabFlags | 4;
      if (pList == (ExprList *)0x0) {
        nTerm = pTVar1->nCol + -1;
        _i = pTVar1->aCol + nTerm;
        _i->colFlags = _i->colFlags | 1;
        pCExpr._4_4_ = 1;
      }
      else {
        pCExpr._4_4_ = pList->nExpr;
        for (local_40 = 0; local_40 < pCExpr._4_4_; local_40 = local_40 + 1) {
          pEVar4 = sqlite3ExprSkipCollate(pList->a[local_40].pExpr);
          sqlite3StringToId(pEVar4);
          if (pEVar4->op == ';') {
            pcVar3 = (pEVar4->u).zToken;
            for (nTerm = 0; nTerm < pTVar1->nCol; nTerm = nTerm + 1) {
              iVar2 = sqlite3StrICmp(pcVar3,pTVar1->aCol[nTerm].zName);
              if (iVar2 == 0) {
                _i = pTVar1->aCol + nTerm;
                _i->colFlags = _i->colFlags | 1;
                break;
              }
            }
          }
        }
      }
      if ((pCExpr._4_4_ == 1) && (_i != (Column *)0x0)) {
        pcVar3 = sqlite3ColumnType(_i,"");
        iVar2 = sqlite3StrICmp(pcVar3,"INTEGER");
        if ((iVar2 == 0) && (sortOrder != 1)) {
          if ((1 < pParse->eParseMode) && (pList != (ExprList *)0x0)) {
            pEVar4 = sqlite3ExprSkipCollate(pList->a[0].pExpr);
            sqlite3RenameTokenRemap(pParse,&pTVar1->iPKey,pEVar4);
          }
          pTVar1->iPKey = (i16)nTerm;
          pTVar1->keyConf = (u8)onError;
          pTVar1->tabFlags = autoInc << 3 | pTVar1->tabFlags;
          if (pList != (ExprList *)0x0) {
            pParse->iPkSortOrder = pList->a[0].sortOrder;
          }
          goto LAB_0019bd46;
        }
      }
      if (autoInc == 0) {
        sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                           (Token *)0x0,(Expr *)0x0,sortOrder,0,'\x02');
        _autoInc_local = (ExprList *)0x0;
      }
      else {
        sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar1->zName);
    }
  }
LAB_0019bd46:
  sqlite3ExprListDelete(pParse->db,_autoInc_local);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    pCol->colFlags |= COLFLAG_PRIMKEY;
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zName)==0 ){
            pCol = &pTab->aCol[iCol];
            pCol->colFlags |= COLFLAG_PRIMKEY;
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && sqlite3StrICmp(sqlite3ColumnType(pCol,""), "INTEGER")==0
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].sortOrder;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}